

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile.cpp
# Opt level: O3

AggregateFunction * __thiscall
duckdb::ScalarDiscreteQuantile::GetFunction<float,duckdb::QuantileStandardType>
          (AggregateFunction *__return_storage_ptr__,ScalarDiscreteQuantile *this,LogicalType *type)

{
  LogicalType *in_RCX;
  LogicalType local_40 [24];
  
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffffd8,(LogicalType *)this);
  duckdb::LogicalType::LogicalType(local_40,(LogicalType *)this);
  AggregateFunction::
  UnaryAggregateDestructor<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float,duckdb::QuantileScalarOperation<true,duckdb::QuantileStandardType>,(duckdb::AggregateDestructorType)1>
            (__return_storage_ptr__,(AggregateFunction *)&stack0xffffffffffffffd8,local_40,in_RCX);
  duckdb::LogicalType::~LogicalType(local_40);
  duckdb::LogicalType::~LogicalType((LogicalType *)&stack0xffffffffffffffd8);
  __return_storage_ptr__->window =
       QuantileScalarOperation<true,duckdb::QuantileStandardType>::
       Window<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float,float>;
  __return_storage_ptr__->window_init =
       QuantileOperation::
       WindowInit<duckdb::QuantileState<float,duckdb::QuantileStandardType>,float>;
  return __return_storage_ptr__;
}

Assistant:

static AggregateFunction GetFunction(const LogicalType &type) {
		using STATE = QuantileState<INPUT_TYPE, TYPE_OP>;
		using OP = QuantileScalarOperation<true>;
		auto fun = AggregateFunction::UnaryAggregateDestructor<STATE, INPUT_TYPE, INPUT_TYPE, OP,
		                                                       AggregateDestructorType::LEGACY>(type, type);
#ifndef DUCKDB_SMALLER_BINARY
		fun.window = OP::Window<STATE, INPUT_TYPE, INPUT_TYPE>;
		fun.window_init = OP::WindowInit<STATE, INPUT_TYPE>;
#endif
		return fun;
	}